

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O3

int run_test_getsockname_tcp(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *puVar3;
  void *pvVar4;
  ushort uVar5;
  code *in_RCX;
  char *pcVar6;
  char *pcVar7;
  uint extraout_EDX;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  uv_udp_t *puVar8;
  anon_union_16_2_bf76bca6_for_active_reqs *paVar9;
  code *pcVar10;
  undefined1 *__size;
  uv_udp_t *puVar11;
  uv_udp_send_t *puVar12;
  uv_loop_t *puVar13;
  void *unaff_R14;
  sockaddr sockname;
  sockaddr_in addr;
  sockaddr peername;
  undefined4 uStack_110;
  int iStack_10c;
  uint uStack_108;
  undefined4 uStack_104;
  short sStack_100;
  short sStack_fe;
  int iStack_fc;
  undefined1 auStack_f0 [24];
  uv_loop_t *puStack_d8;
  undefined1 auStack_c0 [32];
  undefined1 auStack_a0 [16];
  anon_union_16_2_bf76bca6_for_active_reqs aStack_90;
  undefined4 uStack_7c;
  undefined1 auStack_78 [16];
  uv_loop_t *puStack_68;
  code *pcStack_60;
  uint local_4c;
  sockaddr local_48;
  undefined1 local_30 [16];
  undefined4 local_20 [4];
  
  pcStack_60 = (code *)0x15bc58;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_60 = (code *)0x15bc75;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_30);
  if (iVar1 == 0) {
    pcStack_60 = (code *)0x15bc90;
    iVar1 = uv_tcp_init(loop,&tcpServer);
    if (iVar1 != 0) {
      pcStack_60 = (code *)0x15be75;
      run_test_getsockname_tcp_cold_2();
      return 1;
    }
    pcStack_60 = (code *)0x15bcab;
    iVar1 = uv_tcp_bind(&tcpServer,local_30,0);
    if (iVar1 != 0) {
      pcStack_60 = (code *)0x15be7c;
      run_test_getsockname_tcp_cold_3();
      return 1;
    }
    pcStack_60 = (code *)0x15bccb;
    iVar1 = uv_listen(&tcpServer,0x80,on_connection);
    if (iVar1 != 0) {
      pcStack_60 = (code *)0x15be83;
      run_test_getsockname_tcp_cold_4();
      return 1;
    }
    local_48.sa_family = 0xffff;
    local_48.sa_data[0] = -1;
    local_48.sa_data[1] = -1;
    local_48.sa_data[2] = -1;
    local_48.sa_data[3] = -1;
    local_48.sa_data[4] = -1;
    local_48.sa_data[5] = -1;
    local_48.sa_data[6] = -1;
    local_48.sa_data[7] = -1;
    local_48.sa_data[8] = -1;
    local_48.sa_data[9] = -1;
    local_48.sa_data[10] = -1;
    local_48.sa_data[0xb] = -1;
    local_48.sa_data[0xc] = -1;
    local_48.sa_data[0xd] = -1;
    local_4c = 0x10;
    pcStack_60 = (code *)0x15bcf7;
    iVar1 = uv_tcp_getsockname(&tcpServer);
    if (iVar1 != 0) goto LAB_0015be8f;
    pcVar6 = "server socket";
    pcStack_60 = (code *)0x15bd1c;
    check_sockname(&local_48,"0.0.0.0",0x23a3,"server socket");
    getsocknamecount = getsocknamecount + 1;
    local_4c = 0x10;
    pcStack_60 = (code *)0x15bd3e;
    iVar1 = uv_tcp_getpeername(&tcpServer,local_20);
    in_RCX = (code *)pcVar6;
    if (iVar1 != -0x6b) goto LAB_0015be94;
    getpeernamecount = getpeernamecount + 1;
    pcStack_60 = (code *)0x15bd63;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_30);
    in_RCX = (code *)pcVar6;
    if (iVar1 != 0) goto LAB_0015be99;
    pcStack_60 = (code *)0x15bd7e;
    iVar1 = uv_tcp_init(loop,&tcp);
    tcp.data = &connect_req;
    in_RCX = (code *)&connect_req;
    if (iVar1 != 0) goto LAB_0015be9e;
    in_RCX = on_connect;
    pcStack_60 = (code *)0x15bdb3;
    iVar1 = uv_tcp_connect(&connect_req,&tcp,local_30);
    if (iVar1 != 0) goto LAB_0015bea3;
    local_20[0] = 0x10;
    pcStack_60 = (code *)0x15bdd7;
    iVar1 = uv_tcp_getsockname(&tcp,&local_48);
    if (iVar1 != 0) goto LAB_0015bea8;
    if (local_48.sa_family != 2) goto LAB_0015bead;
    uVar5 = local_48.sa_data._0_2_ << 8 | (ushort)local_48.sa_data._0_2_ >> 8;
    in_RCX = (code *)(ulong)uVar5;
    connect_port = (int)uVar5;
    if (local_48.sa_data._0_2_ == 0) goto LAB_0015beb2;
    pcStack_60 = (code *)0x15be16;
    uv_run(loop,0);
    if (getsocknamecount != 3) goto LAB_0015beb7;
    if (getpeernamecount != 3) goto LAB_0015bebc;
    pcStack_60 = (code *)0x15be35;
    unaff_R14 = (void *)uv_default_loop();
    unaff_RBX = (uv_loop_t *)0x0;
    pcStack_60 = (code *)0x15be4b;
    uv_walk(unaff_R14,close_walk_cb,0);
    pcStack_60 = (code *)0x15be55;
    uv_run(unaff_R14,0);
    pcStack_60 = (code *)0x15be5a;
    uVar2 = uv_default_loop();
    pcStack_60 = (code *)0x15be62;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_60 = (code *)0x15be8f;
    run_test_getsockname_tcp_cold_1();
LAB_0015be8f:
    pcStack_60 = (code *)0x15be94;
    run_test_getsockname_tcp_cold_5();
LAB_0015be94:
    pcStack_60 = (code *)0x15be99;
    run_test_getsockname_tcp_cold_6();
LAB_0015be99:
    pcStack_60 = (code *)0x15be9e;
    run_test_getsockname_tcp_cold_7();
LAB_0015be9e:
    pcStack_60 = (code *)0x15bea3;
    run_test_getsockname_tcp_cold_8();
LAB_0015bea3:
    pcStack_60 = (code *)0x15bea8;
    run_test_getsockname_tcp_cold_9();
LAB_0015bea8:
    pcStack_60 = (code *)0x15bead;
    run_test_getsockname_tcp_cold_10();
LAB_0015bead:
    pcStack_60 = (code *)0x15beb2;
    run_test_getsockname_tcp_cold_11();
LAB_0015beb2:
    pcStack_60 = (code *)0x15beb7;
    run_test_getsockname_tcp_cold_15();
LAB_0015beb7:
    pcStack_60 = (code *)0x15bebc;
    run_test_getsockname_tcp_cold_12();
LAB_0015bebc:
    pcStack_60 = (code *)0x15bec1;
    run_test_getsockname_tcp_cold_13();
  }
  pcStack_60 = run_test_getsockname_udp;
  run_test_getsockname_tcp_cold_14();
  paVar9 = &aStack_90;
  auStack_a0._8_8_ = (void *)0x15bed2;
  puStack_68 = unaff_RBX;
  pcStack_60 = (code *)unaff_R14;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar6 = "0.0.0.0";
  puVar8 = (uv_udp_t *)0x23a3;
  auStack_a0._8_8_ = (void *)0x15beef;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_78);
  if (iVar1 == 0) {
    auStack_a0._8_8_ = (void *)0x15bf0a;
    iVar1 = uv_udp_init(loop,&udpServer);
    if (iVar1 != 0) {
      auStack_a0._8_8_ = (void *)0x15c094;
      run_test_getsockname_udp_cold_2();
      return 1;
    }
    auStack_a0._8_8_ = (void *)0x15bf25;
    iVar1 = uv_udp_bind(&udpServer,auStack_78,0);
    if (iVar1 != 0) {
      auStack_a0._8_8_ = (void *)0x15c09b;
      run_test_getsockname_udp_cold_3();
      return 1;
    }
    aStack_90.unused[0] = (void *)0xffffffffffffffff;
    aStack_90.unused[1] = (void *)0xffffffffffffffff;
    uStack_7c = 0x10;
    puVar11 = &udpServer;
    auStack_a0._8_8_ = (void *)0x15bf4f;
    iVar1 = uv_udp_getsockname();
    pcVar7 = (char *)in_RCX;
    puVar8 = (uv_udp_t *)paVar9;
    puVar12 = (uv_udp_send_t *)puVar11;
    if (iVar1 != 0) goto LAB_0015c0a7;
    pcVar7 = "udp listener socket";
    auStack_a0._8_8_ = (void *)0x15bf72;
    check_sockname((sockaddr *)&aStack_90,"0.0.0.0",0x23a3,"udp listener socket");
    getsocknamecount = getsocknamecount + 1;
    puVar11 = &udpServer;
    pcVar10 = alloc;
    auStack_a0._8_8_ = (void *)0x15bf92;
    iVar1 = uv_udp_recv_start(&udpServer,alloc,udp_recv);
    puVar8 = (uv_udp_t *)pcVar10;
    puVar12 = (uv_udp_send_t *)puVar11;
    if (iVar1 != 0) goto LAB_0015c0ac;
    puVar8 = &udp;
    auStack_a0._8_8_ = (void *)0x15bfad;
    puVar12 = (uv_udp_send_t *)loop;
    iVar1 = uv_udp_init();
    if (iVar1 != 0) goto LAB_0015c0b1;
    auStack_a0._8_8_ = (void *)0x15bfc6;
    aStack_90 = (anon_union_16_2_bf76bca6_for_active_reqs)uv_buf_init("PING",4);
    puVar12 = (uv_udp_send_t *)0x194b4a;
    puVar8 = (uv_udp_t *)0x23a3;
    auStack_a0._8_8_ = (void *)0x15bfe5;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_78);
    if (iVar1 != 0) goto LAB_0015c0b6;
    puVar12 = &send_req;
    puVar8 = &udp;
    pcVar7 = (char *)0x1;
    auStack_a0._8_8_ = (void *)0x15c014;
    iVar1 = uv_udp_send(&send_req,&udp,&aStack_90,1,auStack_78,udp_send);
    if (iVar1 != 0) goto LAB_0015c0bb;
    puVar8 = (uv_udp_t *)0x0;
    auStack_a0._8_8_ = (void *)0x15c02a;
    puVar12 = (uv_udp_send_t *)loop;
    uv_run();
    if (getsocknamecount != 2) goto LAB_0015c0c0;
    if (udp.send_queue_size != 0) goto LAB_0015c0c5;
    if (udpServer.send_queue_size != 0) goto LAB_0015c0ca;
    auStack_a0._8_8_ = (void *)0x15c054;
    unaff_R14 = (void *)uv_default_loop();
    unaff_RBX = (uv_loop_t *)0x0;
    auStack_a0._8_8_ = (void *)0x15c06a;
    uv_walk(unaff_R14,close_walk_cb,0);
    puVar8 = (uv_udp_t *)0x0;
    auStack_a0._8_8_ = (void *)0x15c074;
    uv_run(unaff_R14);
    auStack_a0._8_8_ = (void *)0x15c079;
    puVar12 = (uv_udp_send_t *)uv_default_loop();
    auStack_a0._8_8_ = (void *)0x15c081;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    auStack_a0._8_8_ = (void *)0x15c0a7;
    run_test_getsockname_udp_cold_1();
    pcVar7 = (char *)in_RCX;
    puVar12 = (uv_udp_send_t *)pcVar6;
LAB_0015c0a7:
    auStack_a0._8_8_ = (void *)0x15c0ac;
    run_test_getsockname_udp_cold_4();
LAB_0015c0ac:
    auStack_a0._8_8_ = (void *)0x15c0b1;
    run_test_getsockname_udp_cold_5();
LAB_0015c0b1:
    auStack_a0._8_8_ = (void *)0x15c0b6;
    run_test_getsockname_udp_cold_6();
LAB_0015c0b6:
    auStack_a0._8_8_ = (void *)0x15c0bb;
    run_test_getsockname_udp_cold_7();
LAB_0015c0bb:
    auStack_a0._8_8_ = (void *)0x15c0c0;
    run_test_getsockname_udp_cold_8();
LAB_0015c0c0:
    auStack_a0._8_8_ = (void *)0x15c0c5;
    run_test_getsockname_udp_cold_9();
LAB_0015c0c5:
    auStack_a0._8_8_ = (void *)0x15c0ca;
    run_test_getsockname_udp_cold_10();
LAB_0015c0ca:
    auStack_a0._8_8_ = (void *)0x15c0cf;
    run_test_getsockname_udp_cold_11();
  }
  auStack_a0._8_8_ = on_connection;
  run_test_getsockname_udp_cold_12();
  auStack_a0._0_8_ = unaff_RBX;
  auStack_a0._8_8_ = unaff_R14;
  if ((int)puVar8 == 0) {
    puVar13 = (uv_loop_t *)0xf8;
    puVar3 = (uv_loop_t *)malloc(0xf8);
    pcVar10 = (code *)puVar8;
    if (puVar3 == (uv_loop_t *)0x0) goto LAB_0015c1d5;
    pcVar10 = (code *)puVar3;
    puVar13 = loop;
    iVar1 = uv_tcp_init(loop,puVar3);
    unaff_RBX = puVar3;
    if (iVar1 != 0) goto LAB_0015c1da;
    puVar3->data = puVar12;
    pcVar10 = (code *)puVar3;
    iVar1 = uv_accept(puVar12,puVar3);
    if (iVar1 != 0) goto LAB_0015c1df;
    pcVar10 = (code *)(auStack_c0 + 0x10);
    puVar12 = (uv_udp_send_t *)puVar3;
    iVar1 = uv_tcp_getsockname(puVar3,pcVar10);
    if (iVar1 != 0) goto LAB_0015c1e4;
    pcVar7 = "accepted socket";
    check_sockname((sockaddr *)(auStack_c0 + 0x10),"127.0.0.1",0x23a3,"accepted socket");
    getsocknamecount = getsocknamecount + 1;
    pcVar10 = (code *)auStack_c0;
    puVar12 = (uv_udp_send_t *)puVar3;
    iVar1 = uv_tcp_getpeername(puVar3,pcVar10);
    if (iVar1 != 0) goto LAB_0015c1e9;
    pcVar7 = "accepted socket peer";
    check_sockname((sockaddr *)auStack_c0,"127.0.0.1",connect_port,"accepted socket peer");
    getpeernamecount = getpeernamecount + 1;
    pcVar10 = alloc;
    puVar12 = (uv_udp_send_t *)puVar3;
    iVar1 = uv_read_start(puVar3,alloc,after_read);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puVar13 = (uv_loop_t *)((ulong)puVar8 & 0xffffffff);
    on_connection_cold_1();
    pcVar10 = (code *)puVar8;
LAB_0015c1d5:
    on_connection_cold_7();
LAB_0015c1da:
    puVar12 = (uv_udp_send_t *)puVar13;
    on_connection_cold_2();
LAB_0015c1df:
    on_connection_cold_3();
LAB_0015c1e4:
    on_connection_cold_4();
LAB_0015c1e9:
    on_connection_cold_5();
  }
  on_connection_cold_6();
  uStack_110 = *(undefined4 *)&((uv_loop_t *)puVar12)->data;
  iStack_10c = *(int *)((long)&((uv_loop_t *)puVar12)->data + 4);
  uStack_108 = ((uv_loop_t *)puVar12)->active_handles;
  uStack_104 = *(undefined4 *)&((uv_loop_t *)puVar12)->field_0xc;
  __size = (undefined1 *)(ulong)extraout_EDX;
  puStack_d8 = unaff_RBX;
  iVar1 = uv_ip4_addr(pcVar10,__size,&sStack_100);
  if (iVar1 == 0) {
    if ((short)uStack_110 != 2) goto LAB_0015c285;
    if (sStack_100 != 2) goto LAB_0015c28a;
    if (iStack_10c != iStack_fc) goto LAB_0015c28f;
    if ((extraout_EDX != 0) && (uStack_110._2_2_ != sStack_fe)) goto LAB_0015c299;
    __size = auStack_f0;
    iVar1 = uv_ip4_name(&uStack_110,__size,0x11);
    if (iVar1 == 0) {
      iVar1 = printf("%s: %s:%d\n",pcVar7,auStack_f0,
                     (ulong)(ushort)(uStack_110._2_2_ << 8 | uStack_110._2_2_ >> 8));
      return iVar1;
    }
  }
  else {
    check_sockname_cold_1();
LAB_0015c285:
    check_sockname_cold_2();
LAB_0015c28a:
    check_sockname_cold_3();
LAB_0015c28f:
    check_sockname_cold_4();
  }
  check_sockname_cold_6();
LAB_0015c299:
  check_sockname_cold_5();
  pvVar4 = malloc((size_t)__size);
  *extraout_RDX = pvVar4;
  extraout_RDX[1] = __size;
  return (int)pvVar4;
}

Assistant:

TEST_IMPL(getsockname_tcp) {
  loop = uv_default_loop();

  if (tcp_listener())
    return 1;

  tcp_connector();

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(getsocknamecount == 3);
  ASSERT(getpeernamecount == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}